

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNErrCode SUNMatZero_Sparse(SUNMatrix A)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  pvVar1 = A->content;
  for (lVar2 = 0; lVar2 < *(long *)((long)pvVar1 + 0x10); lVar2 = lVar2 + 1) {
    *(undefined8 *)(*(long *)((long)pvVar1 + 0x20) + lVar2 * 8) = 0;
    *(undefined8 *)(*(long *)((long)pvVar1 + 0x30) + lVar2 * 8) = 0;
  }
  lVar2 = *(long *)((long)pvVar1 + 0x38);
  for (lVar3 = 0; lVar3 < *(long *)((long)pvVar1 + 0x18); lVar3 = lVar3 + 1) {
    *(undefined8 *)(lVar2 + lVar3 * 8) = 0;
  }
  *(undefined8 *)(lVar2 + *(long *)((long)pvVar1 + 0x18) * 8) = 0;
  return 0;
}

Assistant:

SUNErrCode SUNMatZero_Sparse(SUNMatrix A)
{
  sunindextype i;

  /* Perform operation */
  for (i = 0; i < SM_NNZ_S(A); i++)
  {
    (SM_DATA_S(A))[i]      = ZERO;
    (SM_INDEXVALS_S(A))[i] = 0;
  }
  for (i = 0; i < SM_NP_S(A); i++) { (SM_INDEXPTRS_S(A))[i] = 0; }
  (SM_INDEXPTRS_S(A))[SM_NP_S(A)] = 0;
  return SUN_SUCCESS;
}